

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O0

void OperExt(OpConfig *EA)

{
  OpConfig *EA_local;
  
  switch(EA->Mode) {
  case 6:
  case 8:
  case 10:
    if ((EA->Value < -0x8000) || (0x7fff < EA->Value)) {
      Error(EA->Loc,9);
    }
    break;
  case 7:
  case 0xb:
    if ((EA->Value < -0x80) || (0x7f < EA->Value)) {
      Error(EA->Loc,9);
    }
    EA->Value = EA->Value & 0xff;
    EA->Value = (long)(EA->Xn << 0xc) | EA->Value;
    if (EA->X == 2) {
      EA->Value = EA->Value | 0x8000;
    }
    if (EA->Xsize == 4) {
      EA->Value = EA->Value | 0x800;
    }
    break;
  case 9:
    break;
  case 0xc:
    if (Size == 2) {
      if ((EA->Value < -0x8000) || (0xffff < EA->Value)) {
        Error(EA->Loc,9);
      }
    }
    else if ((Size == 1) && ((EA->Value < -0x80 || (0xff < EA->Value)))) {
      Error(EA->Loc,9);
    }
  }
  return;
}

Assistant:

void 
OperExt (register struct OpConfig *EA)
/* Calculate operand Extension word, and check range of operands. */
{
	switch (EA->Mode) {
	case AbsL:
		break; /* No range checking is needed. */
	case AbsW:
	case ARDisp:
	case PCDisp:
		if ((EA->Value < -32768) || (EA->Value > 32767))
			Error(EA->Loc, SizeErr);
		break;
	case ARDisX:
	case PCDisX:
		if ((EA->Value < -128) || (EA->Value > 127))
			Error(EA->Loc, SizeErr);
		EA->Value &= 0x00FF; /* Displacement */
		EA->Value |= EA->Xn << 12; /* Index reg. */
		if (EA->X == Areg)
			EA->Value |= 0x8000; /* Addr. Reg. */
		if (EA->Xsize == Long)
			EA->Value |= 0x0800; /* Long reg.  */
		break;
	case Imm:
		if (Size == Word) {
			if ((EA->Value < -32768) || (EA->Value > 65535L))
				Error(EA->Loc, SizeErr);
		} else if (Size == Byte)
			if ((EA->Value < -128) || (EA->Value > 255))
				Error(EA->Loc, SizeErr);
		break;
	}
}